

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

lzma_bool lzma_index_iter_next(lzma_index_iter *iter,lzma_index_iter_mode mode)

{
  undefined1 *puVar1;
  size_t sVar2;
  long *plVar3;
  anon_union_8_3_4e90d293 *paVar4;
  long *plVar5;
  long *plVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  
  if (LZMA_INDEX_ITER_NONEMPTY_BLOCK < mode) {
    return '\x01';
  }
  sVar2 = iter->internal[1].s;
  if (mode == LZMA_INDEX_ITER_STREAM) {
LAB_001c41a7:
    plVar6 = (long *)0x0;
  }
  else {
    puVar1 = (undefined1 *)iter->internal[4].p;
    if (puVar1 == (undefined1 *)0x2) {
      paVar4 = (anon_union_8_3_4e90d293 *)(sVar2 + 0x40);
    }
    else {
      if (puVar1 == &DAT_00000001) {
        plVar5 = (long *)((long *)iter->internal[2].s)[4];
        plVar3 = (long *)iter->internal[2].s;
        if (plVar5 == (long *)0x0) {
          do {
            plVar6 = (long *)plVar3[2];
            if (plVar6 == (long *)0x0) break;
            bVar9 = (long *)plVar6[4] == plVar3;
            plVar3 = plVar6;
          } while (bVar9);
        }
        else {
          do {
            plVar6 = plVar5;
            plVar5 = (long *)plVar6[3];
          } while ((long *)plVar6[3] != (long *)0x0);
        }
        goto LAB_001c4206;
      }
      if (puVar1 != (undefined1 *)0x0) goto LAB_001c41a7;
      paVar4 = iter->internal + 2;
    }
    plVar6 = (long *)paVar4->p;
  }
LAB_001c4206:
  sVar8 = iter->internal[3].s;
LAB_001c4214:
  do {
    if (sVar2 == 0) {
      sVar2 = *(size_t *)(iter->internal[0].s + 8);
      if (LZMA_INDEX_ITER_STREAM < mode) {
        while (*(long *)(sVar2 + 0x40) == 0) {
          sVar8 = sVar2;
          sVar7 = *(size_t *)(sVar2 + 0x20);
          if (*(size_t *)(sVar2 + 0x20) == 0) {
            do {
              sVar2 = *(size_t *)(sVar8 + 0x10);
              if (sVar2 == 0) break;
              bVar9 = *(size_t *)(sVar2 + 0x20) == sVar8;
              sVar8 = sVar2;
            } while (bVar9);
          }
          else {
            do {
              sVar2 = sVar7;
              sVar7 = *(size_t *)(sVar2 + 0x18);
            } while (*(size_t *)(sVar2 + 0x18) != 0);
          }
          if (sVar2 == 0) {
            return '\x01';
          }
        }
      }
LAB_001c42f2:
      plVar6 = *(long **)(sVar2 + 0x40);
LAB_001c42f6:
      sVar7 = 0;
    }
    else {
      if (plVar6 == (long *)0x0) {
        plVar6 = (long *)0x0;
LAB_001c42ab:
        if (plVar6 == (long *)0x0) {
          do {
            sVar8 = *(size_t *)(sVar2 + 0x20);
            sVar7 = sVar2;
            if (*(size_t *)(sVar2 + 0x20) == 0) {
              do {
                sVar2 = *(size_t *)(sVar7 + 0x10);
                if (sVar2 == 0) break;
                bVar9 = *(size_t *)(sVar2 + 0x20) == sVar7;
                sVar7 = sVar2;
              } while (bVar9);
            }
            else {
              do {
                sVar2 = sVar8;
                sVar8 = *(size_t *)(sVar2 + 0x18);
              } while (*(size_t *)(sVar2 + 0x18) != 0);
            }
            if (sVar2 == 0) {
              return '\x01';
            }
          } while ((LZMA_INDEX_ITER_STREAM < mode) && (*(long *)(sVar2 + 0x40) == 0));
          goto LAB_001c42f2;
        }
        goto LAB_001c42f6;
      }
      if ((ulong)plVar6[7] <= sVar8) {
        plVar5 = plVar6;
        plVar3 = (long *)plVar6[4];
        if ((long *)plVar6[4] == (long *)0x0) {
          do {
            plVar6 = (long *)plVar5[2];
            if (plVar6 == (long *)0x0) break;
            bVar9 = (long *)plVar6[4] == plVar5;
            plVar5 = plVar6;
          } while (bVar9);
        }
        else {
          do {
            plVar6 = plVar3;
            plVar3 = (long *)plVar6[3];
          } while ((long *)plVar6[3] != (long *)0x0);
        }
        goto LAB_001c42ab;
      }
      sVar7 = sVar8 + 1;
    }
    if (mode != LZMA_INDEX_ITER_NONEMPTY_BLOCK) goto LAB_001c4332;
    if (sVar7 != 0) {
      sVar8 = sVar7;
      if (plVar6[sVar7 * 2 + 6] != plVar6[sVar7 * 2 + 8]) goto LAB_001c4332;
      goto LAB_001c4214;
    }
    sVar8 = 0;
    if (*plVar6 != plVar6[8]) {
LAB_001c4332:
      iter->internal[1].s = sVar2;
      iter->internal[2].p = plVar6;
      iter->internal[3].s = sVar7;
      iter_set_info(iter);
      return '\0';
    }
  } while( true );
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_index_iter_next(lzma_index_iter *iter, lzma_index_iter_mode mode)
{
	const lzma_index *i;
	const index_stream *stream;
	const index_group *group;
	size_t record;

	// Catch unsupported mode values.
	if ((unsigned int)(mode) > LZMA_INDEX_ITER_NONEMPTY_BLOCK)
		return true;

	i = iter->internal[ITER_INDEX].p;
	stream = iter->internal[ITER_STREAM].p;
	group = NULL;
	record = iter->internal[ITER_RECORD].s;

	// If we are being asked for the next Stream, leave group to NULL
	// so that the rest of the this function thinks that this Stream
	// has no groups and will thus go to the next Stream.
	if (mode != LZMA_INDEX_ITER_STREAM) {
		// Get the pointer to the current group. See iter_set_inf()
		// for explanation.
		switch (iter->internal[ITER_METHOD].s) {
		case ITER_METHOD_NORMAL:
			group = iter->internal[ITER_GROUP].p;
			break;

		case ITER_METHOD_NEXT:
			group = index_tree_next(iter->internal[ITER_GROUP].p);
			break;

		case ITER_METHOD_LEFTMOST:
			group = (const index_group *)(
					stream->groups.leftmost);
			break;
		}
	}

again:
	if (stream == NULL) {
		// We at the beginning of the lzma_index.
		// Locate the first Stream.
		stream = (const index_stream *)(i->streams.leftmost);
		if (mode >= LZMA_INDEX_ITER_BLOCK) {
			// Since we are being asked to return information
			// about the first a Block, skip Streams that have
			// no Blocks.
			while (stream->groups.leftmost == NULL) {
				stream = index_tree_next(&stream->node);
				if (stream == NULL)
					return true;
			}
		}

		// Start from the first Record in the Stream.
		group = (const index_group *)(stream->groups.leftmost);
		record = 0;

	} else if (group != NULL && record < group->last) {
		// The next Record is in the same group.
		++record;

	} else {
		// This group has no more Records or this Stream has
		// no Blocks at all.
		record = 0;

		// If group is not NULL, this Stream has at least one Block
		// and thus at least one group. Find the next group.
		if (group != NULL)
			group = index_tree_next(&group->node);

		if (group == NULL) {
			// This Stream has no more Records. Find the next
			// Stream. If we are being asked to return information
			// about a Block, we skip empty Streams.
			do {
				stream = index_tree_next(&stream->node);
				if (stream == NULL)
					return true;
			} while (mode >= LZMA_INDEX_ITER_BLOCK
					&& stream->groups.leftmost == NULL);

			group = (const index_group *)(
					stream->groups.leftmost);
		}
	}

	if (mode == LZMA_INDEX_ITER_NONEMPTY_BLOCK) {
		// We need to look for the next Block again if this Block
		// is empty.
		if (record == 0) {
			if (group->node.uncompressed_base
					== group->records[0].uncompressed_sum)
				goto again;
		} else if (group->records[record - 1].uncompressed_sum
				== group->records[record].uncompressed_sum) {
			goto again;
		}
	}

	iter->internal[ITER_STREAM].p = stream;
	iter->internal[ITER_GROUP].p = group;
	iter->internal[ITER_RECORD].s = record;

	iter_set_info(iter);

	return false;
}